

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ScanfFunc::ScanfFunc(ScanfFunc *this,bool isFscanf)

{
  byte in_SIL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__ScanfFunc_00d7fe90;
  *(byte *)(in_RDI + 7) = in_SIL & 1;
  *(undefined1 *)(in_RDI + 6) = 1;
  return;
}

Assistant:

explicit ScanfFunc(bool isFscanf) :
        SystemSubroutine(isFscanf ? KnownSystemName::FScanf : KnownSystemName::SScanf,
                         SubroutineKind::Function),
        isFscanf(isFscanf) {
        hasOutputArgs = true;
    }